

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  InstOp IVar5;
  const_pointer pcVar6;
  const_iterator pcVar7;
  const_iterator pcVar8;
  ostream *poVar9;
  ulong uVar10;
  char **ppcVar11;
  size_type sVar12;
  Inst *this_00;
  byte *pbVar13;
  SparseArray<re2::NFA::Thread_*> *pSVar14;
  Thread **ppTVar15;
  undefined8 *puVar16;
  byte in_CL;
  undefined8 *in_RDX;
  StringPiece *in_RSI;
  NFA *in_RDI;
  byte in_R8B;
  long in_R9;
  int in_stack_00000008;
  int i_1;
  iterator i;
  Thread *t;
  int fb;
  Inst *ip;
  int id;
  char *p;
  Threadq *nextq;
  Threadq *runq;
  StringPiece context;
  Thread *in_stack_fffffffffffffa08;
  Prog *in_stack_fffffffffffffa10;
  SparseArray<re2::NFA::Thread_*> *pSVar17;
  undefined4 in_stack_fffffffffffffa18;
  uint in_stack_fffffffffffffa1c;
  Prog *in_stack_fffffffffffffa20;
  char **in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  LogMessage *in_stack_fffffffffffffa50;
  StringPiece local_528;
  int local_514;
  SparseArray<re2::NFA::Thread_*> *local_510;
  Thread *local_508;
  uint local_4fc;
  char *in_stack_fffffffffffffc20;
  StringPiece *in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc34;
  Threadq *in_stack_fffffffffffffc38;
  Threadq *in_stack_fffffffffffffc40;
  NFA *in_stack_fffffffffffffc48;
  byte *local_368;
  SparseArray<re2::NFA::Thread_*> *local_360;
  Prog *local_358 [5];
  char *in_stack_fffffffffffffcd0;
  StringPiece *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  Threadq *in_stack_fffffffffffffce8;
  NFA *in_stack_fffffffffffffcf0;
  Thread *in_stack_fffffffffffffd00;
  LogMessage local_1c0;
  StringPiece local_40;
  long local_30;
  byte local_22;
  byte local_21;
  StringPiece *local_18;
  
  local_21 = in_CL & 1;
  local_22 = in_R8B & 1;
  if (in_RDI->start_ != 0) {
    local_40.data_ = (const_pointer)*in_RDX;
    local_40.size_ = in_RDX[1];
    local_30 = in_R9;
    local_18 = in_RSI;
    pcVar6 = StringPiece::data(&local_40);
    if (pcVar6 == (const_pointer)0x0) {
      local_40.data_ = local_18->data_;
      local_40.size_ = local_18->size_;
    }
    pcVar7 = StringPiece::begin(local_18);
    pcVar8 = StringPiece::begin(&local_40);
    iVar4 = (int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
    if (pcVar8 <= pcVar7) {
      pcVar7 = StringPiece::end(local_18);
      pcVar8 = StringPiece::end(&local_40);
      iVar4 = (int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
      if (pcVar7 <= pcVar8) {
        bVar3 = Prog::anchor_start(in_RDI->prog_);
        if (bVar3) {
          pcVar7 = StringPiece::begin(&local_40);
          pcVar8 = StringPiece::begin(local_18);
          if (pcVar7 != pcVar8) {
            return false;
          }
        }
        bVar3 = Prog::anchor_end(in_RDI->prog_);
        if (bVar3) {
          pcVar7 = StringPiece::end(&local_40);
          pcVar8 = StringPiece::end(local_18);
          if (pcVar7 != pcVar8) {
            return false;
          }
        }
        bVar3 = Prog::anchor_start(in_RDI->prog_);
        local_21 = (local_21 & 1) != 0 || bVar3;
        bVar3 = Prog::anchor_end(in_RDI->prog_);
        if (bVar3) {
          local_22 = 1;
          in_RDI->endmatch_ = true;
        }
        if (in_stack_00000008 < 0) {
          LogMessage::LogMessage
                    (in_stack_fffffffffffffa50,
                     (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                     (int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
          poVar9 = LogMessage::stream((LogMessage *)(local_358 + 1));
          poVar9 = std::operator<<(poVar9,"Bad args: nsubmatch=");
          std::ostream::operator<<(poVar9,in_stack_00000008);
          LogMessage::~LogMessage((LogMessage *)in_stack_fffffffffffffa20);
          return false;
        }
        in_RDI->ncapture_ = in_stack_00000008 << 1;
        in_RDI->longest_ = (bool)(local_22 & 1);
        if (in_stack_00000008 == 0) {
          in_RDI->ncapture_ = 2;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)in_RDI->ncapture_;
        uVar10 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        ppcVar11 = (char **)operator_new__(uVar10);
        in_RDI->match_ = ppcVar11;
        in_RDI->matched_ = false;
        pcVar6 = StringPiece::data(&local_40);
        in_RDI->btext_ = pcVar6;
        pcVar6 = StringPiece::data(local_18);
        sVar12 = StringPiece::size(local_18);
        in_RDI->etext_ = pcVar6 + sVar12;
        local_358[0] = (Prog *)&in_RDI->q0_;
        local_360 = &in_RDI->q1_;
        SparseArray<re2::NFA::Thread_*>::clear((SparseArray<re2::NFA::Thread_*> *)local_358[0]);
        SparseArray<re2::NFA::Thread_*>::clear(local_360);
        memset(in_RDI->match_,0,(long)in_RDI->ncapture_ << 3);
        local_368 = (byte *)StringPiece::data(local_18);
        while( true ) {
          iVar4 = Step(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38
                       ,in_stack_fffffffffffffc34,in_stack_fffffffffffffc28,
                       in_stack_fffffffffffffc20);
          std::swap<re2::SparseArray<re2::NFA::Thread*>*>
                    (&local_360,(SparseArray<re2::NFA::Thread_*> **)local_358);
          SparseArray<re2::NFA::Thread_*>::clear(local_360);
          if (iVar4 != 0) break;
          if (in_RDI->etext_ < local_368) goto LAB_00232dda;
          if (((in_RDI->matched_ & 1U) == 0) &&
             (((local_21 & 1) == 0 ||
              (pbVar13 = (byte *)StringPiece::data(local_18), local_368 == pbVar13)))) {
            local_4fc = Prog::first_byte(in_stack_fffffffffffffa20);
            if (((local_21 & 1) == 0) &&
               ((((iVar4 = SparseArray<re2::NFA::Thread_*>::size
                                     ((SparseArray<re2::NFA::Thread_*> *)local_358[0]), iVar4 == 0
                  && (-1 < (int)local_4fc)) && (local_368 < in_RDI->etext_)) &&
                ((*local_368 != local_4fc &&
                 (local_368 = (byte *)memchr(local_368,local_4fc,
                                             (long)in_RDI->etext_ - (long)local_368),
                 local_368 == (byte *)0x0)))))) {
              local_368 = (byte *)in_RDI->etext_;
            }
            local_508 = AllocThread((NFA *)CONCAT44(in_stack_fffffffffffffa1c,
                                                    in_stack_fffffffffffffa18));
            CopyCapture(in_RDI,local_508->capture,in_RDI->match_);
            *local_508->capture = (char *)local_368;
            if (local_368 < in_RDI->etext_) {
              in_stack_fffffffffffffa1c = (uint)*local_368;
            }
            else {
              in_stack_fffffffffffffa1c = 0xffffffff;
            }
            in_stack_fffffffffffffa08 = local_508;
            in_stack_fffffffffffffa20 = local_358[0];
            AddToThreadq(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                         in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                         in_stack_fffffffffffffd00);
            Decref(in_RDI,local_508);
          }
          iVar4 = SparseArray<re2::NFA::Thread_*>::size
                            ((SparseArray<re2::NFA::Thread_*> *)local_358[0]);
          if (iVar4 == 0) goto LAB_00232dda;
          local_368 = local_368 + 1;
        }
        pcVar1 = in_RDI->etext_;
        while( true ) {
          while( true ) {
            this_00 = Prog::inst(in_stack_fffffffffffffa10,
                                 (int)((ulong)in_stack_fffffffffffffa08 >> 0x20));
            IVar5 = Prog::Inst::opcode(this_00);
            if (IVar5 != kInstCapture) break;
            iVar4 = Prog::Inst::cap(this_00);
            if (iVar4 < in_RDI->ncapture_) {
              in_stack_fffffffffffffa40 = in_RDI->match_;
              iVar4 = Prog::Inst::cap(this_00);
              in_stack_fffffffffffffa40[iVar4] = pcVar1;
            }
            Prog::Inst::out(this_00);
          }
          if (IVar5 == kInstMatch) break;
          if (IVar5 != kInstNop) {
            LogMessage::LogMessage
                      (in_stack_fffffffffffffa50,
                       (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                       (int)((ulong)in_stack_fffffffffffffa40 >> 0x20));
            poVar9 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffb08);
            poVar9 = std::operator<<(poVar9,"Unexpected opcode in short circuit: ");
            IVar5 = Prog::Inst::opcode(this_00);
            std::ostream::operator<<(poVar9,IVar5);
            LogMessage::~LogMessage((LogMessage *)in_stack_fffffffffffffa20);
LAB_00232dda:
            local_510 = (SparseArray<re2::NFA::Thread_*> *)
                        SparseArray<re2::NFA::Thread_*>::begin
                                  ((SparseArray<re2::NFA::Thread_*> *)0x232de7);
            while (pSVar17 = local_510,
                  pSVar14 = (SparseArray<re2::NFA::Thread_*> *)
                            SparseArray<re2::NFA::Thread_*>::end(local_510), pSVar17 != pSVar14) {
              ppTVar15 = SparseArray<re2::NFA::Thread_*>::IndexValue::value((IndexValue *)local_510)
              ;
              Decref(in_RDI,*ppTVar15);
              local_510 = (SparseArray<re2::NFA::Thread_*> *)
                          &(local_510->sparse_).ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                           super__Head_base<0UL,_int_*,_false>;
            }
            if ((in_RDI->matched_ & 1U) == 0) {
              return false;
            }
            for (local_514 = 0; local_514 < in_stack_00000008; local_514 = local_514 + 1) {
              StringPiece::StringPiece
                        (&local_528,in_RDI->match_[local_514 << 1],
                         (long)in_RDI->match_[local_514 * 2 + 1] -
                         (long)in_RDI->match_[local_514 << 1]);
              puVar16 = (undefined8 *)(local_30 + (long)local_514 * 0x10);
              *puVar16 = local_528.data_;
              puVar16[1] = local_528.size_;
            }
            return true;
          }
          Prog::Inst::out(this_00);
        }
        in_RDI->match_[1] = pcVar1;
        in_RDI->matched_ = true;
        goto LAB_00232dda;
      }
    }
    LogMessage::LogMessage
              (in_stack_fffffffffffffa50,
               (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),iVar4);
    poVar9 = LogMessage::stream(&local_1c0);
    std::operator<<(poVar9,"context does not contain text");
    LogMessage::~LogMessage((LogMessage *)in_stack_fffffffffffffa20);
  }
  return false;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "context does not contain text";
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.data();
  // For convenience.
  etext_ = text.data() + text.size();

  if (ExtraDebug)
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            std::string(text).c_str(), std::string(context).c_str(), anchored,
            longest);

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);

  // Loop over the text, stepping the machine.
  for (const char* p = text.data();; p++) {
    if (ExtraDebug) {
      int c = 0;
      if (p == btext_)
        c = '^';
      else if (p > etext_)
        c = '$';
      else if (p < etext_)
        c = p[0] & 0xFF;

      fprintf(stderr, "%c:", c);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->value();
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < etext_ ? p[0] & 0xFF : -1, context, p);
    DCHECK_EQ(runq->size(), 0);
    using std::swap;
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = etext_;
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > etext_)
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.data())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < etext_ && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, etext_ - p));
        if (p == NULL) {
          p = etext_;
        }
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < etext_ ? p[0] & 0xFF : -1, context, p,
                   t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (ExtraDebug)
        fprintf(stderr, "dead\n");
      break;
    }
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->value());

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i] =
          StringPiece(match_[2 * i],
                      static_cast<size_t>(match_[2 * i + 1] - match_[2 * i]));
    if (ExtraDebug)
      fprintf(stderr, "match (%td,%td)\n",
              match_[0] - btext_, match_[1] - btext_);
    return true;
  }
  return false;
}